

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O0

Rect * __thiscall
RTree<int,_double,_2,_double,_8,_4>::NodeCover
          (RTree<int,_double,_2,_double,_8,_4> *this,Node *a_node)

{
  int *in_RDX;
  Rect *in_RSI;
  Rect *in_RDI;
  int index;
  Rect *in_stack_ffffffffffffffc8;
  RTree<int,_double,_2,_double,_8,_4> *in_stack_ffffffffffffffd0;
  double local_28;
  double local_20;
  int local_14;
  
  if (in_RDX != (int *)0x0) {
    in_RDI->m_min[0] = *(double *)(in_RDX + 2);
    in_RDI->m_min[1] = *(double *)(in_RDX + 4);
    in_RDI->m_max[0] = *(double *)(in_RDX + 6);
    in_RDI->m_max[1] = *(double *)(in_RDX + 8);
    for (local_14 = 1; local_14 < *in_RDX; local_14 = local_14 + 1) {
      CombineRect(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_RSI);
      in_RDI->m_min[0] = (double)in_stack_ffffffffffffffc8;
      in_RDI->m_min[1] = (double)in_stack_ffffffffffffffd0;
      in_RDI->m_max[0] = local_28;
      in_RDI->m_max[1] = local_20;
    }
    return in_RDI;
  }
  __assert_fail("a_node",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Oxer11[P]Geo-fencing/yourcode/RTree.h"
                ,0x412,
                "typename RTree<DATATYPE, ELEMTYPE, NUMDIMS, ELEMTYPEREAL, TMAXNODES, TMINNODES>::Rect RTree<int, double, 2>::NodeCover(Node *) [DATATYPE = int, ELEMTYPE = double, NUMDIMS = 2, ELEMTYPEREAL = double, TMAXNODES = 8, TMINNODES = 4]"
               );
}

Assistant:

RTREE_TEMPLATE
typename RTREE_QUAL::Rect RTREE_QUAL::NodeCover(Node* a_node)
{
  ASSERT(a_node);
  
  Rect rect = a_node->m_branch[0].m_rect;
  for(int index = 1; index < a_node->m_count; ++index)
  {
     rect = CombineRect(&rect, &(a_node->m_branch[index].m_rect));
  }
  
  return rect;
}